

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes_hash.cpp
# Opt level: O1

void hashAes1Rx4<false>(void *input,size_t inputSize,void *hash)

{
  undefined1 (*pauVar1) [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  auVar2 = _DAT_00125780;
  auVar3 = _DAT_00125770;
  auVar4 = _DAT_00125760;
  auVar5 = _DAT_00125750;
  if (0 < (long)inputSize) {
    pauVar1 = (undefined1 (*) [16])(inputSize + (long)input);
    do {
      auVar5 = aesenc(auVar5,*input);
      auVar4 = aesdec(auVar4,*(undefined1 (*) [16])((long)input + 0x10));
      auVar3 = aesenc(auVar3,*(undefined1 (*) [16])((long)input + 0x20));
      auVar2 = aesdec(auVar2,*(undefined1 (*) [16])((long)input + 0x30));
      input = (void *)((long)input + 0x40);
    } while (input < pauVar1);
  }
  auVar5 = aesenc(auVar5,_DAT_00125790);
  auVar4 = aesdec(auVar4,_DAT_00125790);
  auVar3 = aesenc(auVar3,_DAT_00125790);
  auVar2 = aesdec(auVar2,_DAT_00125790);
  auVar5 = aesenc(auVar5,_DAT_001257a0);
  auVar4 = aesdec(auVar4,_DAT_001257a0);
  auVar3 = aesenc(auVar3,_DAT_001257a0);
  auVar2 = aesdec(auVar2,_DAT_001257a0);
  *(undefined1 (*) [16])hash = auVar5;
  *(undefined1 (*) [16])((long)hash + 0x10) = auVar4;
  *(undefined1 (*) [16])((long)hash + 0x20) = auVar3;
  *(undefined1 (*) [16])((long)hash + 0x30) = auVar2;
  return;
}

Assistant:

void hashAes1Rx4(const void *input, size_t inputSize, void *hash) {
	assert(inputSize % 64 == 0);
	const uint8_t* inptr = (uint8_t*)input;
	const uint8_t* inputEnd = inptr + inputSize;

	rx_vec_i128 state0, state1, state2, state3;
	rx_vec_i128 in0, in1, in2, in3;

	//intial state
	state0 = rx_set_int_vec_i128(AES_HASH_1R_STATE0);
	state1 = rx_set_int_vec_i128(AES_HASH_1R_STATE1);
	state2 = rx_set_int_vec_i128(AES_HASH_1R_STATE2);
	state3 = rx_set_int_vec_i128(AES_HASH_1R_STATE3);

	//process 64 bytes at a time in 4 lanes
	while (inptr < inputEnd) {
		in0 = rx_load_vec_i128((rx_vec_i128*)inptr + 0);
		in1 = rx_load_vec_i128((rx_vec_i128*)inptr + 1);
		in2 = rx_load_vec_i128((rx_vec_i128*)inptr + 2);
		in3 = rx_load_vec_i128((rx_vec_i128*)inptr + 3);

		state0 = aesenc<softAes>(state0, in0);
		state1 = aesdec<softAes>(state1, in1);
		state2 = aesenc<softAes>(state2, in2);
		state3 = aesdec<softAes>(state3, in3);

		inptr += 64;
	}

	//two extra rounds to achieve full diffusion
	rx_vec_i128 xkey0 = rx_set_int_vec_i128(AES_HASH_1R_XKEY0);
	rx_vec_i128 xkey1 = rx_set_int_vec_i128(AES_HASH_1R_XKEY1);

	state0 = aesenc<softAes>(state0, xkey0);
	state1 = aesdec<softAes>(state1, xkey0);
	state2 = aesenc<softAes>(state2, xkey0);
	state3 = aesdec<softAes>(state3, xkey0);

	state0 = aesenc<softAes>(state0, xkey1);
	state1 = aesdec<softAes>(state1, xkey1);
	state2 = aesenc<softAes>(state2, xkey1);
	state3 = aesdec<softAes>(state3, xkey1);

	//output hash
	rx_store_vec_i128((rx_vec_i128*)hash + 0, state0);
	rx_store_vec_i128((rx_vec_i128*)hash + 1, state1);
	rx_store_vec_i128((rx_vec_i128*)hash + 2, state2);
	rx_store_vec_i128((rx_vec_i128*)hash + 3, state3);
}